

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall
dgPolyhedra::Triangulate(dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes,dgPolyhedra *leftOver)

{
  int iVar1;
  dgTreeNode *pdVar2;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  dgRedBackNode *pdVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Iterator iter;
  dgDownHeap<dgEdge_*,_double> heap;
  Iterator local_70;
  dgDownHeap<dgEdge_*,_double> local_60;
  int local_4c;
  RECORD *local_48;
  dgPolyhedra *local_40;
  HaF64 *local_38;
  
  iVar9 = (this->super_dgTree<dgEdge,_long>).m_count;
  uVar7 = ((uint)(iVar9 - (iVar9 >> 0x1f)) >> 1) * 0x10 + 0x2000;
  local_40 = leftOver;
  local_38 = vertex;
  local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool = (RECORD *)malloc((long)(int)uVar7);
  if ((int)uVar7 < 0) {
    __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                  ,0x60,"T &dgStack<char>::operator[](hacd::HaI32) [T = char]");
  }
  local_60.super_dgHeapBase<dgEdge_*,_double>.m_maxCount = uVar7 >> 4;
  local_60.super_dgHeapBase<dgEdge_*,_double>.m_curCount = 0;
  iVar9 = this->m_edgeMark + 1;
  this->m_edgeMark = iVar9;
  local_48 = local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool;
  if (iVar9 != 0x7fffffff) {
    local_70.m_ptr = (dgRedBackNode *)0x0;
    pdVar2 = (this->super_dgTree<dgEdge,_long>).m_head;
    local_70.m_tree = &this->super_dgTree<dgEdge,_long>;
    if ((pdVar2 != (dgTreeNode *)0x0) &&
       (local_70.m_ptr = dgRedBackNode::Minimum(&pdVar2->super_dgRedBackNode),
       local_70.m_ptr != (dgRedBackNode *)0x0)) {
      local_4c = strideInBytes >> 3;
      do {
        pdVar5 = local_70.m_ptr;
        dgTree<dgEdge,_long>::Iterator::operator++(&local_70,0);
        if ((*(int *)&pdVar5[2]._vptr_dgRedBackNode != iVar9) &&
           (-1 < *(int *)((long)&pdVar5[1]._vptr_dgRedBackNode + 4))) {
          pdVar4 = (dgEdge *)(pdVar5 + 1);
          lVar11 = 8;
          uVar10 = 0;
          pdVar3 = pdVar4;
          do {
            pdVar3->m_mark = iVar9;
            uVar7 = (uint)uVar10;
            uVar10 = (ulong)(uVar7 + 1);
            lVar11 = lVar11 + 4;
            pdVar3 = pdVar3->m_next;
          } while (pdVar3 != pdVar4);
          if (2 < uVar7) {
            pdVar3 = TriangulateFace(this,pdVar4,local_38,local_4c,&local_60,(dgBigVector *)0x0);
            local_60.super_dgHeapBase<dgEdge_*,_double>.m_curCount = 0;
            if (pdVar3 != (dgEdge *)0x0) {
              if (pdVar3->m_incidentFace < 1) {
                __assert_fail("edge->m_incidentFace > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0xd96,
                              "void dgPolyhedra::Triangulate(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                             );
              }
              if (local_40 != (dgPolyhedra *)0x0) {
                lVar8 = 0;
                pdVar4 = pdVar3;
                do {
                  *(HaI32 *)(local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool + 8 + lVar8 * 4) =
                       pdVar4->m_incidentVertex;
                  *(HaU64 *)(local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool + lVar8 * 8 + lVar11
                            ) = pdVar4->m_userData;
                  lVar8 = lVar8 + 1;
                  pdVar4 = pdVar4->m_next;
                } while (pdVar4 != pdVar3);
                AddFace(local_40,(HaI32)lVar8,
                        (HaI32 *)(local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool + 8),
                        (HaI64 *)(local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool +
                                 uVar10 * 4 + 8));
              }
              DeleteFace(this,pdVar3);
              pdVar2 = ((dgTree<dgEdge,_long> *)&(local_70.m_tree)->_vptr_dgTree)->m_head;
              if (pdVar2 == (dgTreeNode *)0x0) {
                local_70.m_ptr = (dgRedBackNode *)0x0;
              }
              else {
                local_70.m_ptr = dgRedBackNode::Minimum(&pdVar2->super_dgRedBackNode);
              }
            }
          }
        }
      } while (local_70.m_ptr != (dgRedBackNode *)0x0);
    }
    OptimizeTriangulation(this,local_38,strideInBytes);
    iVar9 = this->m_edgeMark + 1;
    this->m_edgeMark = iVar9;
    if (iVar9 != 0x7fffffff) {
      this->m_faceSecuence = 1;
      pdVar2 = ((dgTree<dgEdge,_long> *)&(local_70.m_tree)->_vptr_dgTree)->m_head;
      if (pdVar2 == (dgTreeNode *)0x0) {
        local_70.m_ptr = (dgRedBackNode *)0x0;
      }
      else {
        local_70.m_ptr = dgRedBackNode::Minimum(&pdVar2->super_dgRedBackNode);
      }
      if (local_70.m_ptr != (dgRedBackNode *)0x0) {
        do {
          if ((*(int *)&local_70.m_ptr[2]._vptr_dgRedBackNode != iVar9) &&
             (-1 < *(int *)((long)&local_70.m_ptr[1]._vptr_dgRedBackNode + 4))) {
            pdVar5 = local_70.m_ptr + 1;
            if (pdVar5 != (local_70.m_ptr[1].m_right)->m_right->m_right) {
              __assert_fail("edge == edge->m_next->m_next->m_next",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0xdc2,
                            "void dgPolyhedra::Triangulate(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                           );
            }
            iVar1 = this->m_faceSecuence;
            iVar6 = 3;
            do {
              *(int *)((long)&pdVar5->_vptr_dgRedBackNode + 4) = iVar1;
              *(int *)&pdVar5[1]._vptr_dgRedBackNode = iVar9;
              iVar6 = iVar6 + -1;
              pdVar5 = pdVar5->m_right;
            } while (iVar6 != 0);
            this->m_faceSecuence = iVar1 + 1;
          }
          dgTree<dgEdge,_long>::Iterator::operator++(&local_70,0);
        } while (local_70.m_ptr != (dgRedBackNode *)0x0);
      }
      free(local_60.super_dgHeapBase<dgEdge_*,_double>.m_pool);
      free(local_48);
      return;
    }
  }
  __assert_fail("m_edgeMark < 0x7fffffff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
}

Assistant:

void dgPolyhedra::Triangulate (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes, dgPolyhedra* const leftOver)
{
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	hacd::HaI32 count = GetCount() / 2;
	dgStack<char> memPool (hacd::HaI32 ((count + 512) * (2 * sizeof (hacd::HaF64)))); 
	dgDownHeap<dgEdge*, hacd::HaF64> heap(&memPool[0], memPool.GetSizeInBytes());

	hacd::HaI32 mark = IncLRU();
	Iterator iter (*this);
	for (iter.Begin(); iter; ) {
		dgEdge* const thisEdge = &(*iter);
		iter ++;

		if (thisEdge->m_mark == mark) {
			continue;
		}
		if (thisEdge->m_incidentFace < 0) {
			continue;
		}

		count = 0;
		dgEdge* ptr = thisEdge;
		do {
			count ++;
			ptr->m_mark = mark;
			ptr = ptr->m_next;
		} while (ptr != thisEdge);

		if (count > 3) {
			dgEdge* const edge = TriangulateFace (thisEdge, vertex, stride, heap, NULL);
			heap.Flush ();

			if (edge) {
				HACD_ASSERT (edge->m_incidentFace > 0);

				if (leftOver) {
					hacd::HaI32* const index = (hacd::HaI32 *) &heap[0];
					hacd::HaI64* const data = (hacd::HaI64 *)&index[count];
					hacd::HaI32 i = 0;
					dgEdge* ptr = edge;
					do {
						index[i] = ptr->m_incidentVertex;
						data[i] = hacd::HaI64 (ptr->m_userData);
						i ++;
						ptr = ptr->m_next;
					} while (ptr != edge);
					leftOver->AddFace(i, index, data);

				} 
				else 
				{
//					dgTrace (("Deleting face:"));					
//					ptr = edge;
//					do {
//						dgTrace (("%d ", ptr->m_incidentVertex));
//					} while (ptr != edge);
////					dgTrace (("\n"));					
				}

				DeleteFace (edge);
				iter.Begin();
			}
		}
	}

	OptimizeTriangulation (vertex, strideInBytes);

	mark = IncLRU();
	m_faceSecuence = 1;
	for (iter.Begin(); iter; iter ++) {
		dgEdge* edge = &(*iter);
		if (edge->m_mark == mark) {
			continue;
		}
		if (edge->m_incidentFace < 0) {
			continue;
		}
		HACD_ASSERT (edge == edge->m_next->m_next->m_next);

		for (hacd::HaI32 i = 0; i < 3; i ++) { 
			edge->m_incidentFace = m_faceSecuence; 
			edge->m_mark = mark;
			edge = edge->m_next;
		}
		m_faceSecuence ++;
	}
}